

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsReverseNodes(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,299,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
  }
  Abc_NtkIncrementTravId(pNtk);
  iVar1 = Abc_AigLevel(pNtk);
  vNodes = Vec_PtrStart(iVar1 + 1);
  uVar6 = 0;
  uVar4 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar4 = uVar6;
  }
  while( true ) {
    if (uVar6 == uVar4) {
      return vNodes;
    }
    pAVar3 = ppNodes[uVar6];
    uVar2 = *(uint *)&pAVar3->field_0x14 & 0xf;
    if ((uVar2 != 2) && (uVar2 != 5)) break;
    Abc_NodeSetTravIdCurrent(pAVar3);
    pAVar3 = Abc_ObjFanout0Ntk(pAVar3);
    for (lVar5 = 0; lVar5 < (pAVar3->vFanouts).nSize; lVar5 = lVar5 + 1) {
      Abc_NtkDfsReverseNodes_rec
                ((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanouts).pArray[lVar5]],vNodes);
    }
    uVar6 = uVar6 + 1;
  }
  __assert_fail("Abc_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                ,0x133,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodes( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( Abc_AigLevel(pNtk) + 1 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverseNodes_rec( pFanout, vNodes );
    }
    return vNodes;
}